

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<QOpenGLProgramBinaryCache::ShaderDesc>::moveAppend
          (QGenericArrayOps<QOpenGLProgramBinaryCache::ShaderDesc> *this,ShaderDesc *b,ShaderDesc *e
          )

{
  qsizetype *pqVar1;
  ShaderDesc *pSVar2;
  long lVar3;
  Data *pDVar4;
  char *pcVar5;
  qsizetype qVar6;
  
  if ((b != e) && (b < e)) {
    pSVar2 = (this->super_QArrayDataPointer<QOpenGLProgramBinaryCache::ShaderDesc>).ptr;
    do {
      lVar3 = (this->super_QArrayDataPointer<QOpenGLProgramBinaryCache::ShaderDesc>).size;
      pSVar2[lVar3].stage = b->stage;
      pDVar4 = (b->source).d.d;
      (b->source).d.d = (Data *)0x0;
      pSVar2[lVar3].source.d.d = pDVar4;
      pcVar5 = (b->source).d.ptr;
      (b->source).d.ptr = (char *)0x0;
      pSVar2[lVar3].source.d.ptr = pcVar5;
      qVar6 = (b->source).d.size;
      (b->source).d.size = 0;
      pSVar2[lVar3].source.d.size = qVar6;
      b = b + 1;
      pqVar1 = &(this->super_QArrayDataPointer<QOpenGLProgramBinaryCache::ShaderDesc>).size;
      *pqVar1 = *pqVar1 + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }